

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall YAML::Parser::PrintTokens(Parser *this,ostream *out)

{
  bool bVar1;
  ostream *poVar2;
  Scanner *in_RSI;
  Token *in_stack_00000088;
  ostream *in_stack_00000090;
  Scanner *in_stack_ffffffffffffffe0;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<YAML::Scanner,_std::default_delete<YAML::Scanner>_> *)0xf13dcd);
  if (bVar1) {
    while( true ) {
      std::unique_ptr<YAML::Scanner,_std::default_delete<YAML::Scanner>_>::operator->
                ((unique_ptr<YAML::Scanner,_std::default_delete<YAML::Scanner>_> *)0xf13ddf);
      bVar1 = Scanner::empty(in_stack_ffffffffffffffe0);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      in_stack_ffffffffffffffe0 = in_RSI;
      std::unique_ptr<YAML::Scanner,_std::default_delete<YAML::Scanner>_>::operator->
                ((unique_ptr<YAML::Scanner,_std::default_delete<YAML::Scanner>_> *)0xf13e03);
      Scanner::peek(in_stack_ffffffffffffffe0);
      poVar2 = YAML::operator<<(in_stack_00000090,in_stack_00000088);
      std::operator<<(poVar2,"\n");
      std::unique_ptr<YAML::Scanner,_std::default_delete<YAML::Scanner>_>::operator->
                ((unique_ptr<YAML::Scanner,_std::default_delete<YAML::Scanner>_> *)0xf13e31);
      Scanner::pop(in_stack_ffffffffffffffe0);
    }
  }
  return;
}

Assistant:

void Parser::PrintTokens(std::ostream& out) {
  if (!m_pScanner) {
    return;
  }

  while (!m_pScanner->empty()) {
    out << m_pScanner->peek() << "\n";
    m_pScanner->pop();
  }
}